

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

TailCallParseFunc google::protobuf::GetFastParseFunction(TcParseFunction func)

{
  LogMessage *this;
  code *pcVar1;
  undefined7 in_register_00000039;
  LogMessage local_20;
  
  if ((byte)(func + ~kDiscardEverythingFallback) < 0x85) {
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xd97);
    this = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (&local_20,(char (*) [26])"Failed to find function: ");
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (this,(int)CONCAT71(in_register_00000039,func));
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_20);
    pcVar1 = internal::TcParser::MiniParse;
  }
  else {
    pcVar1 = GetFastParseFunction::kFuncs[func];
  }
  return pcVar1;
}

Assistant:

static internal::TailCallParseFunc GetFastParseFunction(
    internal::TcParseFunction func) {
#define PROTOBUF_TC_PARSE_FUNCTION_X(value) internal::TcParser::value,
  static constexpr internal::TailCallParseFunc kFuncs[] = {
      {}, PROTOBUF_TC_PARSE_FUNCTION_LIST};
#undef PROTOBUF_TC_PARSE_FUNCTION_X
  const int index = static_cast<int>(func);
  if (index < 0 || index >= std::end(kFuncs) - std::begin(kFuncs) ||
      kFuncs[index] == nullptr) {
    ABSL_DLOG(FATAL) << "Failed to find function: " << static_cast<int>(func);
    // Let's not crash in opt, just in case.
    // MiniParse is always a valid parser.
    return &internal::TcParser::MiniParse;
  }
  return kFuncs[index];
}